

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type,bool normalized)

{
  undefined3 in_register_00000009;
  long in_FS_OFFSET;
  bool apostrophe;
  Span<const_unsigned_char> s;
  string local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((CONCAT31(in_register_00000009,normalized) != 0) ||
     (apostrophe = true, *(char *)((long)this + 0x38) == '\0')) {
    apostrophe = type == COMPAT;
  }
  s.m_size = 4;
  s.m_data = (uchar *)((long)this + 0x10);
  HexStr_abi_cxx11_(&local_40,s);
  FormatHDKeypath_abi_cxx11_
            (&local_60,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)this + 0x18),
             apostrophe);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string OriginString(StringType type, bool normalized=false) const
    {
        // If StringType==COMPAT, always use the apostrophe to stay compatible with previous versions
        bool use_apostrophe = (!normalized && m_apostrophe) || type == StringType::COMPAT;
        return HexStr(m_origin.fingerprint) + FormatHDKeypath(m_origin.path, use_apostrophe);
    }